

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_intmath.h
# Opt level: O0

OPJ_INT32 opj_int_sub_no_overflow(OPJ_INT32 a,OPJ_INT32 b)

{
  OPJ_INT32 *ipres;
  void *pures;
  OPJ_UINT32 ures;
  OPJ_UINT32 *upb;
  OPJ_UINT32 *upa;
  void *pb;
  void *pa;
  OPJ_INT32 b_local;
  OPJ_INT32 a_local;
  
  return a - b;
}

Assistant:

static INLINE OPJ_INT32 opj_int_sub_no_overflow(OPJ_INT32 a, OPJ_INT32 b)
{
    void* pa = &a;
    void* pb = &b;
    OPJ_UINT32* upa = (OPJ_UINT32*)pa;
    OPJ_UINT32* upb = (OPJ_UINT32*)pb;
    OPJ_UINT32 ures = *upa - *upb;
    void* pures = &ures;
    OPJ_INT32* ipres = (OPJ_INT32*)pures;
    return *ipres;
}